

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_encrypted_extensions
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  int iVar1;
  uint8_t *puVar2;
  undefined4 uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t found [8];
  int ret;
  uint16_t type;
  uint8_t *end;
  uint8_t *src;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  puVar2 = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x38;
  src = (uint8_t *)properties;
  properties_local = (ptls_handshake_properties_t *)tls;
  memset(&_capacity,0,8);
  _block_size = 2;
  if ((ulong)((long)puVar2 - (long)end) < 2) {
    found[0] = '2';
    found[1] = '\0';
    found[2] = '\0';
    found[3] = '\0';
  }
  else {
    end_1 = (uint8_t *)0x0;
    do {
      puVar4 = end + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
      _block_size = _block_size - 1;
      end = puVar4;
    } while (_block_size != 0);
    if (puVar2 + -(long)puVar4 < end_1) {
      found[0] = '2';
      found[1] = '\0';
      found[2] = '\0';
      found[3] = '\0';
    }
    else {
      puVar4 = puVar4 + (long)end_1;
      do {
        while( true ) {
          if (end == puVar4) {
            if (end != puVar4) {
              return 0x32;
            }
            if (end != puVar2) {
              return 0x32;
            }
            key_schedule_update_hash
                      (*(st_ptls_key_schedule_t **)((long)properties_local + 0x50),
                       (uint8_t *)tls_local,(size_t)message_local.base);
            uVar3 = 4;
            if ((char)(*(char *)((long)properties_local + 0x118) << 5) < '\0') {
              uVar3 = 6;
            }
            *(undefined4 *)&(properties_local->client).session_ticket.len = uVar3;
            return 0x202;
          }
          iVar1 = decode16((uint16_t *)(found + 6),&end,puVar4);
          found[0] = (char)iVar1;
          found[1] = (char)((uint)iVar1 >> 8);
          found[2] = (char)((uint)iVar1 >> 0x10);
          found[3] = (char)((uint)iVar1 >> 0x18);
          if (iVar1 != 0) {
            return iVar1;
          }
          if ((ushort)found._6_2_ < 8) {
            if (((uint)found[(long)(int)((ushort)found._6_2_ / 8) + -8] &
                1 << (sbyte)((ulong)(ushort)found._6_2_ % 8)) != 0) {
              return 0x2f;
            }
            found[(long)(int)((ushort)found._6_2_ / 8) + -8] =
                 found[(long)(int)((ushort)found._6_2_ / 8) + -8] |
                 (byte)(1 << ((byte)found._6_2_ & 0x1f)) & 7;
          }
          _block_size_1 = 2;
          if ((ulong)((long)puVar4 - (long)end) < 2) {
            return 0x32;
          }
          end_2 = (uint8_t *)0x0;
          do {
            puVar5 = end + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end);
            _block_size_1 = _block_size_1 - 1;
            end = puVar5;
          } while (_block_size_1 != 0);
          if (puVar4 + -(long)puVar5 < end_2) {
            return 0x32;
          }
          end = puVar5 + (long)end_2;
          if (found._6_2_ == 0) break;
          if (found._6_2_ == 0x2a) {
            if (-1 < (char)(*(char *)((long)properties_local + 0x118) << 6)) {
              return 0x2f;
            }
            if (src != (uint8_t *)0x0) {
              src[0x18] = src[0x18] & 0xfe | 1;
            }
          }
        }
        if (puVar5 != end) {
          return 0x32;
        }
      } while (*(long *)((long)properties_local + 0xe8) != 0);
      found[0] = '/';
      found[1] = '\0';
      found[2] = '\0';
      found[3] = '\0';
    }
  }
  iVar1._0_1_ = found[0];
  iVar1._1_1_ = found[1];
  iVar1._2_1_ = found[2];
  iVar1._3_1_ = found[3];
  return iVar1;
}

Assistant:

static int client_handle_encrypted_extensions(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *end = message.base + message.len;
    uint16_t type;
    int ret;

    decode_extensions(src, end, &type, {
        switch (type) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (tls->server_name == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if (!tls->client.send_early_data) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            if (properties != NULL)
                properties->client.early_data_accepted_by_peer = 1;
            break;
        default:
            break;
        }
        src = end;
    });

    key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = tls->client.is_psk ? PTLS_STATE_CLIENT_EXPECT_FINISHED : PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;

Exit:
    return ret;
}